

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O2

bool death_prog_outer_guardian(CHAR_DATA *mob,CHAR_DATA *killer)

{
  OBJ_DATA *pOVar1;
  bool bVar2;
  bool bVar3;
  CHAR_DATA *pCVar4;
  CHAR_DATA *pCVar5;
  CHAR_DATA **ppCVar6;
  OBJ_DATA *obj;
  char buf [4608];
  
  do_cb(mob,"Alas, my life has come to an end.");
  pCVar4 = get_cabal_guardian((int)mob->cabal);
  if (pCVar4 != (CHAR_DATA *)0x0) {
    pOVar1 = pCVar4->carrying;
    while (obj = pOVar1, obj != (OBJ_DATA *)0x0) {
      pOVar1 = obj->next_content;
      bVar2 = isCabalItem(obj);
      if ((bVar2) && (obj->pIndexData->cabal != pCVar4->cabal)) {
        ppCVar6 = &killer->in_room->people;
        bVar2 = false;
        while( true ) {
          pCVar5 = *ppCVar6;
          if (pCVar5 == (CHAR_DATA *)0x0) break;
          bVar3 = is_same_group(pCVar5,killer);
          if (bVar3) {
            bVar2 = (bool)(bVar2 | obj->pIndexData->cabal == pCVar5->cabal);
          }
          ppCVar6 = &pCVar5->next_in_room;
        }
        if (bVar2) {
          pCVar5 = get_cabal_guardian((int)obj->pIndexData->cabal);
          if (pCVar5 != (CHAR_DATA *)0x0) {
            sprintf(buf,"As %s falls, %s returns to %s!",mob->short_descr,obj->short_descr,
                    pCVar5->short_descr);
            obj_from_char(obj);
            obj_to_char(obj,pCVar5);
            act(buf,mob,(void *)0x0,(void *)0x0,4);
            cabal_shudder((int)obj->pIndexData->cabal,false);
          }
        }
      }
    }
    save_cabal_items();
  }
  return false;
}

Assistant:

bool death_prog_outer_guardian(CHAR_DATA *mob, CHAR_DATA *killer)
{
	CHAR_DATA *cabalguardian, *othercabalguardian, *vch;
	char buf[MSL];
	OBJ_DATA *obj, *obj_next;
	bool present;

	do_cb(mob, "Alas, my life has come to an end.");

	if ((cabalguardian = get_cabal_guardian(mob->cabal)) != nullptr)
	{
		for (obj = cabalguardian->carrying; obj != nullptr; obj = obj_next)
		{
			present= false;
			obj_next = obj->next_content;

			if (!isCabalItem(obj))
				continue;

			if (obj->pIndexData->cabal != cabalguardian->cabal)
			{
				for (vch = killer->in_room->people; vch != nullptr; vch = vch->next_in_room)
				{
					if (is_same_group(vch, killer))
					{
						if (obj->pIndexData->cabal == vch->cabal)
						{
							present = true;
						}
					}
				}
				if (present && (othercabalguardian = get_cabal_guardian(obj->pIndexData->cabal)) != nullptr)
				{
					sprintf(buf, "As %s falls, %s returns to %s!",
						mob->short_descr,
						obj->short_descr,
						othercabalguardian->short_descr);

					obj_from_char(obj);
					obj_to_char(obj, othercabalguardian);

					act(buf, mob, 0, 0, TO_ALL);
					cabal_shudder(obj->pIndexData->cabal, false);
				}
			}
		}

		save_cabal_items();
	}

	return false;
}